

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O1

SetRawIssueAssetResponseStruct *
cfd::js::api::ElementsTransactionStructApi::SetRawIssueAsset
          (SetRawIssueAssetResponseStruct *__return_storage_ptr__,
          SetRawIssueAssetRequestStruct *request)

{
  _Rb_tree_header *p_Var1;
  string *in_R8;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  _Any_data local_148;
  undefined1 local_138 [16];
  undefined1 local_128 [64];
  _Alloc_hider local_e8;
  char local_d8 [16];
  _Alloc_hider local_c8;
  char local_b8 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_78;
  vector<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
  local_48;
  
  (__return_storage_ptr__->hex)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->hex).field_2;
  (__return_storage_ptr__->hex)._M_string_length = 0;
  (__return_storage_ptr__->hex).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->issuances).
  super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->issuances).
  super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->issuances).
           super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->issuances).
           super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (__return_storage_ptr__->error).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).type.field_2;
  (__return_storage_ptr__->error).type._M_string_length = 0;
  (__return_storage_ptr__->error).type.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).message._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).message.field_2;
  (__return_storage_ptr__->error).message._M_string_length = 0;
  (__return_storage_ptr__->error).message.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_168._0_8_ = (pointer)0x0;
  local_168._8_8_ = 0;
  local_158._8_8_ =
       std::
       _Function_handler<cfd::js::api::SetRawIssueAssetResponseStruct_(const_cfd::js::api::SetRawIssueAssetRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:1689:20)>
       ::_M_invoke;
  local_158._0_8_ =
       std::
       _Function_handler<cfd::js::api::SetRawIssueAssetResponseStruct_(const_cfd::js::api::SetRawIssueAssetRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:1689:20)>
       ::_M_manager;
  local_148._M_unused._M_object = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"SetRawIssueAsset","");
  ExecuteStructApi<cfd::js::api::SetRawIssueAssetRequestStruct,cfd::js::api::SetRawIssueAssetResponseStruct>
            ((SetRawIssueAssetResponseStruct *)local_128,(api *)request,
             (SetRawIssueAssetRequestStruct *)local_168,
             (function<cfd::js::api::SetRawIssueAssetResponseStruct_(const_cfd::js::api::SetRawIssueAssetRequestStruct_&)>
              *)&local_148,in_R8);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_128);
  local_48.
  super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__return_storage_ptr__->issuances).
       super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (__return_storage_ptr__->issuances).
       super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (__return_storage_ptr__->issuances).
       super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->issuances).
  super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_128._32_8_;
  (__return_storage_ptr__->issuances).
  super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_128._40_8_;
  (__return_storage_ptr__->issuances).
  super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_128._48_8_;
  local_128._32_8_ = (pointer)0x0;
  local_128._40_8_ = (pointer)0x0;
  local_128._48_8_ = (pointer)0x0;
  std::
  vector<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
  ::~vector(&local_48);
  (__return_storage_ptr__->error).code = local_128._56_4_;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->error).type,(string *)&local_e8);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->error).message,(string *)&local_c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->error).ignore_items._M_t);
  if (_Stack_a8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &_Stack_a8._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = _Stack_a8._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = _Stack_a8._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = _Stack_a8._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = _Stack_a8._M_impl.super__Rb_tree_header._M_header._M_right;
    (_Stack_a8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         _Stack_a8._M_impl.super__Rb_tree_header._M_node_count;
    _Stack_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->ignore_items)._M_t);
  if (_Stack_78._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &_Stack_78._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _Stack_78._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         _Stack_78._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         _Stack_78._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_78._M_impl.super__Rb_tree_header._M_header._M_right;
    (_Stack_78._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         _Stack_78._M_impl.super__Rb_tree_header._M_node_count;
    _Stack_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_78._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_78._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_78._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&_Stack_78);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&_Stack_a8);
  if (local_c8._M_p != local_b8) {
    operator_delete(local_c8._M_p);
  }
  if (local_e8._M_p != local_d8) {
    operator_delete(local_e8._M_p);
  }
  std::
  vector<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
  ::~vector((vector<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
             *)(local_128 + 0x20));
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_);
  }
  if ((undefined1 *)local_148._M_unused._0_8_ != local_138) {
    operator_delete(local_148._M_unused._M_object);
  }
  if ((code *)local_158._0_8_ != (code *)0x0) {
    (*(code *)local_158._0_8_)(local_168,local_168,3);
  }
  return __return_storage_ptr__;
}

Assistant:

SetRawIssueAssetResponseStruct ElementsTransactionStructApi::SetRawIssueAsset(
    const SetRawIssueAssetRequestStruct& request) {
  auto call_func = [](const SetRawIssueAssetRequestStruct& request)
      -> SetRawIssueAssetResponseStruct {  // NOLINT
    SetRawIssueAssetResponseStruct response;

    ElementsAddressFactory address_factory;
    std::vector<TxInIssuanceParameters> issuance_param;
    std::vector<IssuanceOutput> issuance_output;

    for (auto& issuance : request.issuances) {
      ConfidentialTxOut asset_txout;
      ConfidentialTxOut token_txout;
      Amount asset_amount =
          Amount::CreateBySatoshiAmount(issuance.asset_amount);
      Amount token_amount =
          Amount::CreateBySatoshiAmount(issuance.token_amount);

      if (ElementsConfidentialAddress::IsConfidentialAddress(
              issuance.asset_address)) {
        ElementsConfidentialAddress confidential_addr(issuance.asset_address);
        if (issuance.is_remove_nonce) {
          asset_txout = ConfidentialTxOut(
              confidential_addr.GetUnblindedAddress(), ConfidentialAssetId(),
              asset_amount);
        } else {
          asset_txout = ConfidentialTxOut(
              confidential_addr, ConfidentialAssetId(), asset_amount);
        }
      } else {
        Address unblind_addr =
            address_factory.GetAddress(issuance.asset_address);
        asset_txout = ConfidentialTxOut(
            unblind_addr, ConfidentialAssetId(), asset_amount);
      }

      if (ElementsConfidentialAddress::IsConfidentialAddress(
              issuance.token_address)) {
        ElementsConfidentialAddress confidential_addr(issuance.token_address);
        if (issuance.is_remove_nonce) {
          token_txout = ConfidentialTxOut(
              confidential_addr.GetUnblindedAddress(), ConfidentialAssetId(),
              token_amount);
        } else {
          token_txout = ConfidentialTxOut(
              confidential_addr, ConfidentialAssetId(), token_amount);
        }
      } else {
        Address unblind_addr =
            address_factory.GetAddress(issuance.token_address);
        token_txout = ConfidentialTxOut(
            unblind_addr, ConfidentialAssetId(), token_amount);
      }

      TxInIssuanceParameters param;
      param.txid = Txid(issuance.txid);
      param.vout = issuance.vout;
      param.asset_amount = asset_amount;
      param.asset_txout = asset_txout;
      param.token_amount = token_amount;
      param.token_txout = token_txout;
      if (!issuance.contract_hash.empty()) {
        param.contract_hash = ByteData256(issuance.contract_hash);
      }
      param.is_blind = issuance.is_blind;
      issuance_param.push_back(param);
    }

    ElementsTransactionApi api;
    ConfidentialTransactionController ctxc =
        api.SetRawIssueAsset(request.tx, issuance_param, &issuance_output);

    for (const auto& output : issuance_output) {
      IssuanceDataResponseStruct res_issuance;
      res_issuance.txid = output.txid.GetHex();
      res_issuance.vout = output.vout;
      res_issuance.asset = output.output.asset.GetHex();
      res_issuance.entropy = output.output.entropy.GetHex();
      res_issuance.token = output.output.token.GetHex();

      response.issuances.push_back(res_issuance);
    }

    // すべて設定後にTxoutのRandomSort
    if (request.is_random_sort_tx_out) {
      ctxc.RandomSortTxOut();
    }
    response.hex = ctxc.GetHex();
    return response;
  };

  SetRawIssueAssetResponseStruct result;
  result = ExecuteStructApi<
      SetRawIssueAssetRequestStruct, SetRawIssueAssetResponseStruct>(
      request, call_func, std::string(__FUNCTION__));

  return result;
}